

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O1

CSVOption<unsigned_long> duckdb::CSVOption<unsigned_long>::Deserialize(Deserializer *deserializer)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  _func_int **pp_Var4;
  undefined4 extraout_var;
  CSVOption<unsigned_long> CVar5;
  
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"set_by_user");
  pp_Var4 = deserializer->_vptr_Deserializer;
  if ((char)uVar1 == '\0') {
    uVar2 = 0;
  }
  else {
    uVar2 = (*pp_Var4[0xc])(deserializer);
    pp_Var4 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var4[5])(deserializer,(ulong)(uVar1 & 0xff));
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"value");
  iVar3 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
  CVar5.value._4_4_ = extraout_var;
  CVar5.value._0_4_ = iVar3;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  CVar5._4_4_ = 0;
  CVar5._0_4_ = uVar2;
  return CVar5;
}

Assistant:

CSVOption<T> CSVOption<T>::Deserialize(Deserializer &deserializer) {
	CSVOption<T> result;
	deserializer.ReadPropertyWithDefault<bool>(100, "set_by_user", result.set_by_user);
	deserializer.ReadProperty<T>(101, "value", result.value);
	return result;
}